

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

Builder * arangodb::velocypack::Collection::sort
                    (Builder *__return_storage_ptr__,Slice array,
                    function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>
                    *lessthan)

{
  pointer pSVar1;
  ValueLength __n;
  Exception *this;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *__range1;
  Slice *pSVar2;
  ValueLength index;
  Slice *s;
  pointer pSVar3;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> subValues;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> local_88;
  uint8_t *local_68;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *local_60;
  Slice local_58;
  _Any_data local_50;
  _Manager_type local_40;
  
  local_68 = array._start;
  if (SliceStaticData::TypeMap[*array._start] == Array) {
    local_88.
    super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>.
    _M_impl.super__Vector_impl_data._M_start = (Slice *)0x0;
    local_88.
    super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>.
    _M_impl.super__Vector_impl_data._M_finish = (Slice *)0x0;
    local_88.
    super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &local_68);
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::reserve
              (&local_88,__n);
    local_60 = lessthan;
    if (__n != 0) {
      index = 0;
      do {
        local_58 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::at
                             ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *
                              )&local_68,index);
        std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::
        emplace_back<arangodb::velocypack::Slice>(&local_88,&local_58);
        index = index + 1;
      } while (__n != index);
    }
    pSVar3 = local_88.
             super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar1 = local_88.
             super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::function
              ((function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
               &local_50,local_60);
    std::
    sort<__gnu_cxx::__normal_iterator<arangodb::velocypack::Slice*,std::vector<arangodb::velocypack::Slice,std::allocator<arangodb::velocypack::Slice>>>,std::function<bool(arangodb::velocypack::Slice,arangodb::velocypack::Slice)>>
              ((__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                )pSVar1,(__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                         )pSVar3,
               (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
               &local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    Builder::Builder(__return_storage_ptr__);
    pSVar2 = (Slice *)0x6;
    Builder::openCompoundValue(__return_storage_ptr__,'\x06');
    pSVar1 = local_88.
             super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar3 = local_88.
                  super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1)
    {
      pSVar2 = pSVar3;
      Builder::addInternal<arangodb::velocypack::Slice>(__return_storage_ptr__,pSVar3);
    }
    Builder::close(__return_storage_ptr__,(int)pSVar2);
    if (local_88.
        super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
        ._M_impl.super__Vector_impl_data._M_start != (Slice *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this,InvalidValueType,"Expecting type Array");
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Builder Collection::sort(
    Slice array,
    std::function<bool(Slice, Slice)> lessthan) {
  if (!array.isArray()) {
    throw Exception(Exception::InvalidValueType, "Expecting type Array");
  }
  std::vector<Slice> subValues;
  ValueLength len = array.length();
  subValues.reserve(checkOverflow(len));
  for (ValueLength i = 0; i < len; i++) {
    subValues.push_back(array[i]);
  }
  std::sort(subValues.begin(), subValues.end(), lessthan);
  Builder b;
  b.openArray();
  for (auto const& s : subValues) {
    b.add(s);
  }
  b.close();
  return b;
}